

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O3

void libtorrent::dht::anon_unknown_20::put_mutable_item_callback
               (item *it,int responses,
               shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx> *ctx,
               function<void_(const_libtorrent::dht::item_&,_int)> *cb)

{
  element_type *peVar1;
  int local_4;
  
  peVar1 = (ctx->
           super___shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  peVar1->response_count = responses + peVar1->response_count;
  peVar1->active_traversals = peVar1->active_traversals + -1;
  if (peVar1->active_traversals == 0) {
    if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*cb->_M_invoker)((_Any_data *)cb,it,&local_4);
  }
  return;
}

Assistant:

void put_mutable_item_callback(item const& it, int responses, std::shared_ptr<put_item_ctx> ctx
		, std::function<void(item const&, int)> cb)
	{
		ctx->response_count += responses;
		if (--ctx->active_traversals == 0)
			cb(it, ctx->response_count);
	}